

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordlist.c
# Opt level: O2

size_t wordlist_lookup_word(words *w,char *word)

{
  ulong uVar1;
  char **ppcVar2;
  int iVar3;
  void *pvVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  
  if (w->sorted == false) {
    uVar1 = w->len;
    lVar6 = 0;
    pvVar4 = (void *)0x0;
    uVar5 = 0;
    while ((uVar5 < uVar1 && (pvVar4 == (void *)0x0))) {
      ppcVar2 = w->indices;
      iVar3 = strcmp(word,*(char **)((long)ppcVar2 + lVar6));
      if (iVar3 == 0) {
        pvVar4 = (void *)((long)ppcVar2 + lVar6);
      }
      else {
        pvVar4 = (void *)0x0;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 8;
    }
  }
  else {
    pvVar4 = bsearch(word,w->indices,w->len,8,bstrcmp);
  }
  if (pvVar4 == (void *)0x0) {
    sVar7 = 0;
  }
  else {
    sVar7 = ((long)pvVar4 - (long)w->indices >> 3) + 1;
  }
  return sVar7;
}

Assistant:

size_t wordlist_lookup_word(const struct words *w, const char *word)
{
    const size_t size = sizeof(const char *);
    const char **found = NULL;

    if (w->sorted)
        found = (const char **)bsearch(word, w->indices, w->len, size, bstrcmp);
    else {
        size_t i;
        for (i = 0; i < w->len && !found; ++i)
            if (!strcmp(word, w->indices[i]))
                found = w->indices + i;
    }
    return found ? found - w->indices + 1u : 0u;
}